

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

int __thiscall QtMWidgets::TextLabelPrivate::init(TextLabelPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QPalette *this_00;
  QColor *pQVar2;
  QSizePolicy local_4c;
  QWidget local_48 [4];
  QSizePolicy sp;
  Flags local_40 [5];
  Alignment local_2c;
  QTextOption local_28 [8];
  QTextOption opt;
  TextLabelPrivate *this_local;
  
  QStaticText::setTextFormat((int)this + 8);
  QTextOption::QTextOption(local_28);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_2c,AlignLeading);
  QTextOption::setAlignment(local_28,local_2c);
  QFlags<QTextOption::Flag>::QFlags(local_40,IncludeTrailingSpaces);
  QTextOption::setFlags(local_28,local_40[0]);
  QTextOption::setWrapMode(local_28,WordWrap);
  QStaticText::setTextOption((QTextOption *)&this->staticText);
  QWidget::fontMetrics(local_48);
  iVar1 = QFontMetrics::averageCharWidth();
  QStaticText::setTextWidth((double)(iVar1 * 10));
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_48);
  QSizePolicy::QSizePolicy(&local_4c,Preferred,Preferred,DefaultType);
  QSizePolicy::setHeightForWidth(&local_4c,true);
  QWidget::setSizePolicy((QSizePolicy *)this->q);
  this_00 = (QPalette *)QWidget::palette();
  pQVar2 = QPalette::color(this_00,WindowText);
  *(undefined8 *)&this->color = *(undefined8 *)pQVar2;
  *(undefined4 *)((long)&(this->color).ct + 4) = *(undefined4 *)((long)&pQVar2->ct + 4);
  (this->color).ct.argb.pad = (pQVar2->ct).argb.pad;
  iVar1 = QTextOption::~QTextOption(local_28);
  return iVar1;
}

Assistant:

void
TextLabelPrivate::init()
{
	staticText.setTextFormat( Qt::AutoText );

	QTextOption opt;
	opt.setAlignment( Qt::AlignLeft );
	opt.setFlags( QTextOption::IncludeTrailingSpaces );
	opt.setWrapMode( QTextOption::WordWrap );
	staticText.setTextOption( opt );

	staticText.setTextWidth( q->fontMetrics().averageCharWidth() * 10 );

	QSizePolicy sp( QSizePolicy::Preferred, QSizePolicy::Preferred );
	sp.setHeightForWidth( true );
	q->setSizePolicy( sp );

	color = q->palette().color( QPalette::WindowText );
}